

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O2

EGLConfig eglu::chooseConfig(Library *egl,EGLDisplay display,RenderConfig *config)

{
  SurfaceType SVar1;
  void *pvVar2;
  long lVar3;
  EGLConfig pvVar4;
  uint uVar5;
  deUint32 dVar6;
  NotSupportedError *this;
  long lVar7;
  EGLint renderableType;
  EGLDisplay local_58;
  pointer local_50;
  vector<void_*,_std::allocator<void_*>_> configs;
  
  local_58 = display;
  getConfigs(&configs,egl,display);
  do {
    if (configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"Matching EGL config not found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0x108);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pvVar2 = *configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    renderableType = 0;
    local_50 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar5 = apiRenderableType((ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
    (*egl->_vptr_Library[0x19])(egl,local_58,pvVar2,0x3040,&renderableType);
    dVar6 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar6,"getConfigAttrib(display, eglConfig, EGL_RENDERABLE_TYPE, &renderableType)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0xc4);
    if ((renderableType & uVar5) != 0) {
      SVar1 = config->surfaceType;
      if ((long)(int)SVar1 == 0) {
LAB_00189c22:
        lVar7 = 0;
        do {
          if (lVar7 == 0x80) {
            pvVar4 = *local_50;
            std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                      (&configs.super__Vector_base<void_*,_std::allocator<void_*>_>);
            return pvVar4;
          }
          lVar3 = *(long *)((long)&configMatches(eglw::Library_const&,void*,void*,glu::RenderConfig_const&)
                                   ::s_attribs + lVar7);
          if (*(int *)((long)&(config->type).super_ApiType.m_bits + lVar3) != -1) {
            renderableType = 0;
            (*egl->_vptr_Library[0x19])
                      (egl,local_58,pvVar2,(ulong)*(uint *)((long)&DAT_00223e18 + lVar7),
                       &renderableType);
            dVar6 = (*egl->_vptr_Library[0x1f])(egl);
            checkError(dVar6,
                       "getConfigAttrib(display, eglConfig, s_attribs[attribNdx].attrib, &value)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                       ,0xf4);
            if (renderableType != *(int *)((long)&(config->type).super_ApiType.m_bits + lVar3))
            goto LAB_00189c92;
          }
          lVar7 = lVar7 + 0x10;
        } while( true );
      }
      renderableType = 0;
      uVar5 = 0;
      if (SVar1 < SURFACETYPE_LAST) {
        uVar5 = *(uint *)(&DAT_00223ebc + (long)(int)SVar1 * 4);
      }
      (*egl->_vptr_Library[0x19])(egl,local_58,pvVar2,0x3033,&renderableType);
      dVar6 = (*egl->_vptr_Library[0x1f])(egl);
      checkError(dVar6,"getConfigAttrib(display, eglConfig, EGL_SURFACE_TYPE, &surfaceType)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0xd8);
      if ((renderableType & uVar5) != 0) goto LAB_00189c22;
    }
LAB_00189c92:
    configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = local_50 + 1;
  } while( true );
}

Assistant:

EGLConfig chooseConfig (const Library& egl, EGLDisplay display, const glu::RenderConfig& config)
{
	const std::vector<EGLConfig> configs = eglu::getConfigs(egl, display);

	for (vector<EGLConfig>::const_iterator iter = configs.begin(); iter != configs.end(); ++iter)
	{
		if (configMatches(egl, display, *iter, config))
			return *iter;
	}

	throw tcu::NotSupportedError("Matching EGL config not found", DE_NULL, __FILE__, __LINE__);
}